

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::updateTransitionMatricesWithMultipleModels
          (BeagleCPUImpl<double,_1,_0> *this,int *eigenIndices,int *categoryRateIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          double *edgeLengths,int count)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (0 < count) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      if (secondDerivativeIndices != (int *)0x0 || firstDerivativeIndices == (int *)0x0) {
        if (secondDerivativeIndices == (int *)0x0 || firstDerivativeIndices == (int *)0x0) {
          piVar1 = (int *)0x0;
          lVar2 = 0;
        }
        else {
          piVar1 = (int *)((long)firstDerivativeIndices + lVar3);
          lVar2 = (long)secondDerivativeIndices + lVar3;
        }
      }
      else {
        lVar2 = 0;
        piVar1 = firstDerivativeIndices + lVar4;
      }
      (*this->gEigenDecomposition->_vptr_EigenDecomposition[3])
                (this->gEigenDecomposition,(ulong)*(uint *)((long)eigenIndices + lVar3),
                 (long)probabilityIndices + lVar3,piVar1,lVar2,edgeLengths,
                 this->gCategoryRates[*(int *)((long)categoryRateIndices + lVar3)],
                 this->gTransitionMatrices,1);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 4;
      edgeLengths = edgeLengths + 1;
    } while ((ulong)(uint)count << 2 != lVar3);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::updateTransitionMatricesWithMultipleModels(const int* eigenIndices,
                                                                                  const int* categoryRateIndices,
                                                                                  const int* probabilityIndices,
                                                                                  const int* firstDerivativeIndices,
                                                                                  const int* secondDerivativeIndices,
                                                                                  const double* edgeLengths,
                                                                                  int count) {

    // TODO: move loop to within gEigenDecomposition

    for (int i = 0; i < count; i++) {
        // printf("uTMWMM %d %d %f %d\n", eigenIndices[i], probabilityIndices[i], edgeLengths[i], categoryRateIndices[i]);

        const int* firstDeriv  = NULL;
        const int* secondDeriv = NULL;
        if (firstDerivativeIndices != NULL && secondDerivativeIndices == NULL) {
            firstDeriv = &firstDerivativeIndices[i];
        } else if (firstDerivativeIndices != NULL && secondDerivativeIndices != NULL) {
            firstDeriv  = &firstDerivativeIndices[i];
            secondDeriv = &secondDerivativeIndices[i];
        }

        gEigenDecomposition->updateTransitionMatrices(eigenIndices[i],
                                                      &probabilityIndices[i],
                                                      firstDeriv,
                                                      secondDeriv,
                                                      &edgeLengths[i],
                                                      gCategoryRates[categoryRateIndices[i]],
                                                      gTransitionMatrices,
                                                      1);
    }

    return BEAGLE_SUCCESS;
}